

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O1

void LZ4_resetStreamHC_fast(LZ4_streamHC_t *LZ4_streamHCPtr,int compressionLevel)

{
  int iVar1;
  short sVar2;
  LZ4_streamHC_t *LZ4_streamHCPtr_1;
  
  if ((LZ4_streamHCPtr->internal_donotuse).dirty == '\0') {
    (LZ4_streamHCPtr->internal_donotuse).end =
         (LZ4_streamHCPtr->internal_donotuse).end + -(long)LZ4_streamHCPtr->table[0x8001];
    LZ4_streamHCPtr->table[0x8001] = (void *)0x0;
    LZ4_streamHCPtr->table[0x8005] = (void *)0x0;
  }
  else if (((ulong)LZ4_streamHCPtr & 7) == 0 && LZ4_streamHCPtr != (LZ4_streamHC_t *)0x0) {
    memset(LZ4_streamHCPtr,0,0x40030);
    (LZ4_streamHCPtr->internal_donotuse).compressionLevel = 9;
  }
  iVar1 = 0xc;
  if ((uint)compressionLevel < 0xc) {
    iVar1 = compressionLevel;
  }
  sVar2 = 9;
  if (0 < compressionLevel) {
    sVar2 = (short)iVar1;
  }
  (LZ4_streamHCPtr->internal_donotuse).compressionLevel = sVar2;
  return;
}

Assistant:

void LZ4_resetStreamHC_fast (LZ4_streamHC_t* LZ4_streamHCPtr, int compressionLevel)
{
    DEBUGLOG(4, "LZ4_resetStreamHC_fast(%p, %d)", LZ4_streamHCPtr, compressionLevel);
    if (LZ4_streamHCPtr->internal_donotuse.dirty) {
        LZ4_initStreamHC(LZ4_streamHCPtr, sizeof(*LZ4_streamHCPtr));
    } else {
        /* preserve end - base : can trigger clearTable's threshold */
        LZ4_streamHCPtr->internal_donotuse.end -= (uptrval)LZ4_streamHCPtr->internal_donotuse.base;
        LZ4_streamHCPtr->internal_donotuse.base = NULL;
        LZ4_streamHCPtr->internal_donotuse.dictCtx = NULL;
    }
    LZ4_setCompressionLevel(LZ4_streamHCPtr, compressionLevel);
}